

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

Privkey * __thiscall
cfd::core::Privkey::operator+=(Privkey *__return_storage_ptr__,Privkey *this,Privkey *right)

{
  Privkey key;
  Privkey PStack_38;
  
  CreateTweakAdd(&PStack_38,this,right);
  operator=(this,&PStack_38);
  Privkey(__return_storage_ptr__,this);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&PStack_38);
  return __return_storage_ptr__;
}

Assistant:

Privkey Privkey::operator+=(const Privkey &right) {
  Privkey key = CreateTweakAdd(right);
  *this = key;
  return *this;
}